

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastpack20(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  uint uVar2;
  
  uVar2 = (uint)*in & 0xfffff;
  *out = uVar2;
  uVar1 = in[1];
  *out = (uint)uVar1 << 0x14 | uVar2;
  uVar2 = (uint)uVar1 >> 0xc & 0xff;
  out[1] = uVar2;
  out[1] = ((uint)in[2] & 0xfffff) << 8 | uVar2;
  Unroller<(unsigned_short)20,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack20(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<20>::Pack(in, out);
}